

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O0

bool handleGetBulkRequestPDU
               (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
               deque<VarBind,_std::allocator<VarBind>_> *varbindList,
               deque<VarBind,_std::allocator<VarBind>_> *outResponseList,uint nonRepeaters,
               uint maxRepititions)

{
  ValueCallback *__args;
  deque<VarBind,std::allocator<VarBind>> *pdVar1;
  deque<VarBind,_std::allocator<VarBind>_> *pdVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  element_type *peVar6;
  bool bVar7;
  undefined1 local_f0 [24];
  undefined1 local_d8 [8];
  shared_ptr<BER_CONTAINER> value_1;
  shared_ptr<ImplicitNullType> local_c0;
  ValueCallback *local_b0;
  ValueCallback *callback_1;
  size_t sStack_a0;
  uint j;
  size_t foundAt;
  shared_ptr<OIDType> oid;
  uint i_1;
  uint repeatingVarBinds;
  undefined1 local_78 [8];
  shared_ptr<BER_CONTAINER> value;
  shared_ptr<ImplicitNullType> local_50;
  ValueCallback *local_40;
  ValueCallback *callback;
  VarBind *requestVarBind;
  uint local_28;
  uint i;
  uint maxRepititions_local;
  uint nonRepeaters_local;
  deque<VarBind,_std::allocator<VarBind>_> *outResponseList_local;
  deque<VarBind,_std::allocator<VarBind>_> *varbindList_local;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks_local;
  
  local_28 = maxRepititions;
  i = nonRepeaters;
  _maxRepititions_local = (deque<VarBind,std::allocator<VarBind>> *)outResponseList;
  outResponseList_local = varbindList;
  varbindList_local = (deque<VarBind,_std::allocator<VarBind>_> *)callbacks;
  if (nonRepeaters != 0) {
    requestVarBind._4_4_ = 0;
    while( true ) {
      bVar7 = false;
      if (requestVarBind._4_4_ < i) {
        uVar3 = (ulong)requestVarBind._4_4_;
        sVar4 = Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::size
                          ((deque<VarBind,_std::allocator<VarBind>_> *)outResponseList_local);
        bVar7 = uVar3 < sVar4;
      }
      if (!bVar7) break;
      callback = (ValueCallback *)
                 Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::operator[]
                           ((deque<VarBind,_std::allocator<VarBind>_> *)outResponseList_local,
                            (ulong)requestVarBind._4_4_);
      pdVar2 = varbindList_local;
      peVar6 = Catch::clara::std::__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)callback);
      local_40 = ValueCallback::findCallback
                           ((deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)pdVar2,
                            peVar6,true,0,(size_t *)0x0);
      pdVar1 = _maxRepititions_local;
      __args = callback;
      if (local_40 == (ValueCallback *)0x0) {
        std::make_shared<ImplicitNullType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&local_50);
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                  (pdVar1,(VarBind *)__args,&local_50);
        std::shared_ptr<ImplicitNullType>::~shared_ptr(&local_50);
      }
      else {
        ValueCallback::getValueForCallback((ValueCallback *)local_78,local_40);
        bVar7 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
        if (bVar7) {
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<VarBind_const&,std::shared_ptr<BER_CONTAINER>&>
                    (_maxRepititions_local,(VarBind *)callback,(shared_ptr<BER_CONTAINER> *)local_78
                    );
        }
        else {
          repeatingVarBinds = 5;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    (_maxRepititions_local,&local_40->OID,&repeatingVarBinds);
        }
        Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                  ((shared_ptr<BER_CONTAINER> *)local_78);
      }
      requestVarBind._4_4_ = requestVarBind._4_4_ + 1;
    }
  }
  sVar4 = Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::size
                    ((deque<VarBind,_std::allocator<VarBind>_> *)outResponseList_local);
  if (i < sVar4) {
    sVar4 = Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::size
                      ((deque<VarBind,_std::allocator<VarBind>_> *)outResponseList_local);
    oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         (int)sVar4 - i;
    for (oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
        (uint)oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
        oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
             (uint)oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
        ) {
      pvVar5 = Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::operator[]
                         ((deque<VarBind,_std::allocator<VarBind>_> *)outResponseList_local,
                          (ulong)((uint)oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi + i));
      Catch::clara::std::shared_ptr<OIDType>::shared_ptr
                ((shared_ptr<OIDType> *)&foundAt,&pvVar5->oid);
      sStack_a0 = 0;
      for (callback_1._4_4_ = 0; pdVar2 = varbindList_local, callback_1._4_4_ < local_28;
          callback_1._4_4_ = callback_1._4_4_ + 1) {
        peVar6 = Catch::clara::std::__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)&foundAt);
        local_b0 = ValueCallback::findCallback
                             ((deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)pdVar2,
                              peVar6,true,sStack_a0,&stack0xffffffffffffff60);
        pdVar1 = _maxRepititions_local;
        if (local_b0 == (ValueCallback *)0x0) {
          value_1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = 0x82;
          std::make_shared<ImplicitNullType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&local_c0);
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<std::shared_ptr<OIDType>&,std::shared_ptr<ImplicitNullType>>
                    (pdVar1,(shared_ptr<OIDType> *)&foundAt,&local_c0);
          std::shared_ptr<ImplicitNullType>::~shared_ptr(&local_c0);
          break;
        }
        ValueCallback::getValueForCallback((ValueCallback *)local_d8,local_b0);
        bVar7 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d8);
        if (bVar7) {
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                    (_maxRepititions_local,&local_b0->OID,(shared_ptr<BER_CONTAINER> *)local_d8);
          OIDType::cloneOID((OIDType *)local_f0);
          std::shared_ptr<OIDType>::operator=
                    ((shared_ptr<OIDType> *)&foundAt,(shared_ptr<OIDType> *)local_f0);
          Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)local_f0);
        }
        else {
          local_f0._20_4_ = 5;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    (_maxRepititions_local,&local_b0->OID,
                     (ERROR_STATUS_WITH_VALUE *)(local_f0 + 0x14));
        }
        Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                  ((shared_ptr<BER_CONTAINER> *)local_d8);
        if (!bVar7) break;
      }
      Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)&foundAt);
    }
  }
  return true;
}

Assistant:

bool handleGetBulkRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, unsigned int nonRepeaters, unsigned int maxRepititions){
    // from https://tools.ietf.org/html/rfc1448#page-18
    SNMP_LOGD("handleGetBulkRequestPDU, nonRepeaters:%d, maxRepititions:%d, varbindSize:%ld\n", nonRepeaters, maxRepititions, varbindList.size());
    // nonRepeaters is MIN(nonRepeaters, varbindList.size()
    // repeaters is the extra of varbindList.size() - nonRepeaters) which get 'walked' maxRepititions times

    SNMP_LOGD("handling nonRepeaters\n");
    if(nonRepeaters > 0){
        // handle GET normally, but mark endOfMibView if not found
        for(unsigned int i = 0; i < nonRepeaters && i < varbindList.size(); i++){
            const VarBind& requestVarBind = varbindList[i];
            ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), true);
            if(!callback){
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
                continue;
            }

            auto value = ValueCallback::getValueForCallback(callback);
            if(!value){
                SNMP_LOGD("Couldn't get value for callback\n");
                outResponseList.emplace_back(callback->OID, GEN_ERR);
                continue;   
            }
            outResponseList.emplace_back(requestVarBind, value);
        }
    }

    if(varbindList.size() > nonRepeaters){
        // For each extra varbind, WALK that tree until maxRepititions or endOfMibView
        SNMP_LOGD("handling repeaters\n");
        unsigned int repeatingVarBinds = varbindList.size() - nonRepeaters;
        
        for(unsigned int i = 0; i < repeatingVarBinds; i++){
            // Store first varbind to get for each line
            auto oid = varbindList[i+nonRepeaters].oid;
            size_t foundAt = 0;

            for(unsigned int j = 0; j < maxRepititions; j++){
                SNMP_LOGD("finding next callback for OID: %s\n", oid->string().c_str());
                ValueCallback* callback = ValueCallback::findCallback(callbacks, oid.get(), true, foundAt, &foundAt);
                if(!callback){
                    // We're done, mark endOfMibView
                    outResponseList.emplace_back(oid, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
                    break;
                }

                auto value = ValueCallback::getValueForCallback(callback);

                if(!value){
                    SNMP_LOGD("Couldn't get value for callback\n");
                    outResponseList.emplace_back(callback->OID, GEN_ERR);
                    break;   
                }
                
                outResponseList.emplace_back(callback->OID, value);

                // set next oid to callback OID
                oid = callback->OID->cloneOID();
            }

            //SNMP_LOGD("Walked tree of %s, %d times", (*varbindList)[i+nonRepeaters]->oid->_value, j);
        }
    }

    return true;
}